

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>::
initialize<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>
          (optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>> *this,
          Animatable<tinyusdz::UsdUVTexture::Wrap> *value)

{
  bool bVar1;
  Animatable<tinyusdz::UsdUVTexture::Wrap> *value_local;
  optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::has_value
                    ((optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>, V = tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>]"
                 );
  }
  detail::storage_t<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::construct_value
            ((storage_t<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)(this + 8),value);
  *this = (optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>)0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }